

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a14fb::MicTestPlugIn::update
          (MicTestPlugIn *this,float currentTime,float elapsedTime)

{
  Vec3 *pVVar1;
  float *pfVar2;
  AABBox *pAVar3;
  uint i;
  ulong uVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar5;
  
  for (uVar4 = 0; uVar4 < this->m_PlayerCountA; uVar4 = uVar4 + 1) {
    (**(code **)(*(long *)&((this->TeamA).
                            super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_SimpleVehicle).
                           super_SimpleVehicle_3.
                           super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                + 0x110))(currentTime,elapsedTime);
  }
  for (uVar4 = 0; uVar4 < this->m_PlayerCountB; uVar4 = uVar4 + 1) {
    (**(code **)(*(long *)&((this->TeamB).
                            super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_SimpleVehicle).
                           super_SimpleVehicle_3.
                           super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                + 0x110))(currentTime,elapsedTime);
  }
  (*(this->m_Ball->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x22])(currentTime,elapsedTime);
  pAVar3 = this->m_TeamAGoal;
  (*(this->m_Ball->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])();
  fVar5 = (pAVar3->m_min).x;
  if ((fVar5 <= extraout_XMM0_Da) &&
     (pVVar1 = &pAVar3->m_max, extraout_XMM0_Da < pVVar1->x || extraout_XMM0_Da == pVVar1->x)) {
    pAVar3 = this->m_TeamAGoal;
    (*(this->m_Ball->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])();
    if (((pAVar3->m_min).z <= fVar5) &&
       (pfVar2 = &(pAVar3->m_max).z, fVar5 < *pfVar2 || fVar5 == *pfVar2)) {
      Ball::reset(this->m_Ball);
      this->m_redScore = this->m_redScore + 1;
    }
  }
  pAVar3 = this->m_TeamBGoal;
  (*(this->m_Ball->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])();
  fVar5 = (pAVar3->m_min).x;
  if ((fVar5 <= extraout_XMM0_Da_00) &&
     (pVVar1 = &pAVar3->m_max, extraout_XMM0_Da_00 < pVVar1->x || extraout_XMM0_Da_00 == pVVar1->x))
  {
    pAVar3 = this->m_TeamBGoal;
    (*(this->m_Ball->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])();
    if (((pAVar3->m_min).z <= fVar5) &&
       (pfVar2 = &(pAVar3->m_max).z, fVar5 < *pfVar2 || fVar5 == *pfVar2)) {
      Ball::reset(this->m_Ball);
      this->m_blueScore = this->m_blueScore + 1;
    }
  }
  return;
}

Assistant:

void update (const float currentTime, const float elapsedTime)
        {
            // update simulation of test vehicle
            for(unsigned int i=0; i < m_PlayerCountA ; i++)
                TeamA[i]->update (currentTime, elapsedTime);
            for(unsigned int i=0; i < m_PlayerCountB ; i++)
                TeamB[i]->update (currentTime, elapsedTime);
            m_Ball->update(currentTime, elapsedTime);

            if(m_TeamAGoal->InsideX(m_Ball->position()) && m_TeamAGoal->InsideZ(m_Ball->position()))
            {
                m_Ball->reset();	// Ball in blue teams goal, red scores
                m_redScore++;
            }
            if(m_TeamBGoal->InsideX(m_Ball->position()) && m_TeamBGoal->InsideZ(m_Ball->position()))
            {
                m_Ball->reset();	// Ball in red teams goal, blue scores
                    m_blueScore++;
            }

        }